

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  BtShared *pBVar1;
  u32 uVar2;
  BtShared *pBt;
  int *pSchemaVersion_local;
  int wrflag_local;
  Btree *p_local;
  
  if (((p->sharable == '\0') && (p->inTrans != '\0')) && ((p->inTrans != '\x01' || (wrflag == 0))))
  {
    pBVar1 = p->pBt;
    if (pSchemaVersion != (int *)0x0) {
      uVar2 = sqlite3Get4byte(pBVar1->pPage1->aData + 0x28);
      *pSchemaVersion = uVar2;
    }
    if (wrflag == 0) {
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = sqlite3PagerOpenSavepoint(pBVar1->pPager,p->db->nSavepoint);
    }
  }
  else {
    p_local._4_4_ = btreeBeginTrans(p,wrflag,pSchemaVersion);
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag, int *pSchemaVersion){
  BtShared *pBt;
  if( p->sharable
   || p->inTrans==TRANS_NONE
   || (p->inTrans==TRANS_READ && wrflag!=0)
  ){
    return btreeBeginTrans(p,wrflag,pSchemaVersion);
  }
  pBt = p->pBt;
  if( pSchemaVersion ){
    *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
  }
  if( wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    return sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }else{
    return SQLITE_OK;
  }
}